

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O0

void sys_get_audio_settings(t_audiosettings *a)

{
  int iVar1;
  t_audiosettings *a_local;
  
  if (initted == 0) {
    audio_nextsettings.a_api = 9;
    audio_nextsettings.a_srate = 0xac44;
    audio_nextsettings.a_nchoutdev = 1;
    audio_nextsettings.a_noutdev = 1;
    audio_nextsettings.a_nchindev = 1;
    audio_nextsettings.a_nindev = 1;
    audio_nextsettings.a_outdevvec[0] = 0;
    audio_nextsettings.a_indevvec[0] = 0;
    audio_nextsettings.a_choutdevvec[0] = 2;
    audio_nextsettings.a_chindevvec[0] = 2;
    audio_nextsettings.a_advance = 0x19;
    audio_nextsettings.a_blocksize = 0x40;
    initted = 1;
  }
  memcpy(a,&audio_nextsettings,100);
  iVar1 = audio_isfixedsr(a->a_api);
  if (iVar1 != 0) {
    a->a_srate = (int)(pd_maininstance.pd_stuff)->st_dacsr;
  }
  iVar1 = audio_isfixedblocksize(a->a_api);
  if (iVar1 != 0) {
    iVar1 = audio_getfixedblocksize(a->a_api);
    a->a_blocksize = iVar1;
  }
  return;
}

Assistant:

void sys_get_audio_settings(t_audiosettings *a)
{
    if (!initted)
    {
        audio_nextsettings.a_api = API_DEFAULT;
        audio_nextsettings.a_srate = DEFAULTSRATE;
        audio_nextsettings.a_nindev = audio_nextsettings.a_nchindev =
            audio_nextsettings.a_noutdev = audio_nextsettings.a_nchoutdev
                = 1;
        audio_nextsettings.a_indevvec[0] =
            audio_nextsettings.a_outdevvec[0] = DEFAULTAUDIODEV;
        audio_nextsettings.a_chindevvec[0] =
            audio_nextsettings.a_choutdevvec[0] = SYS_DEFAULTCH;
        audio_nextsettings.a_advance = DEFAULTADVANCE;
        audio_nextsettings.a_blocksize = DEFDACBLKSIZE;
        initted = 1;
    }
    *a = audio_nextsettings;
    if (audio_isfixedsr(a->a_api))
        a->a_srate = STUFF->st_dacsr;
    if (audio_isfixedblocksize(a->a_api))
        a->a_blocksize = audio_getfixedblocksize(a->a_api);
}